

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

int ppcemb_tlb_search(CPUPPCState_conflict2 *env,target_ulong address,uint32_t pid)

{
  int iVar1;
  int local_34;
  int ret;
  int i;
  hwaddr raddr;
  ppcemb_tlb_t_conflict2 *tlb;
  target_ulong tStack_18;
  uint32_t pid_local;
  target_ulong address_local;
  CPUPPCState_conflict2 *env_local;
  
  local_34 = 0;
  tlb._4_4_ = pid;
  tStack_18 = address;
  address_local = (target_ulong)env;
  while( true ) {
    if (*(int *)(address_local + 0xac8) <= local_34) {
      return -1;
    }
    raddr = *(long *)(address_local + 0xae8) + (long)local_34 * 0x28;
    iVar1 = ppcemb_tlb_check((CPUPPCState_conflict2 *)address_local,(ppcemb_tlb_t_conflict2 *)raddr,
                             (hwaddr *)&ret,tStack_18,tlb._4_4_,0,local_34);
    if (iVar1 == 0) break;
    local_34 = local_34 + 1;
  }
  return local_34;
}

Assistant:

static int ppcemb_tlb_search(CPUPPCState *env, target_ulong address,
                             uint32_t pid)
{
    ppcemb_tlb_t *tlb;
    hwaddr raddr;
    int i, ret;

    /* Default return value is no match */
    ret = -1;
    for (i = 0; i < env->nb_tlb; i++) {
        tlb = &env->tlb.tlbe[i];
        if (ppcemb_tlb_check(env, tlb, &raddr, address, pid, 0, i) == 0) {
            ret = i;
            break;
        }
    }

    return ret;
}